

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.hpp
# Opt level: O0

shared_ptr<helics::BrokerFactory::BrokerBuilder>
helics::BrokerFactory::
addBrokerType<helics::NetworkBroker<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4,18>>
          (string_view brokerTypeName,int code)

{
  string_view name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *in_RDI;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> sVar1;
  shared_ptr<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18>_>_>
  bld;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *bbld;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *this;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *__r;
  int in_stack_ffffffffffffffbc;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  element_type *in_stack_ffffffffffffffd0;
  
  this = (shared_ptr<helics::BrokerFactory::BrokerBuilder> *)&stack0xffffffffffffffd0;
  __r = in_RDI;
  std::
  make_shared<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4,18>>>
            ();
  uVar2 = 0;
  std::
  static_pointer_cast<helics::BrokerFactory::BrokerBuilder,helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4,18>>>
            ((shared_ptr<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18>_>_>
              *)__r);
  std::shared_ptr<helics::BrokerFactory::BrokerBuilder>::shared_ptr(this,in_RDI);
  name._M_len._7_1_ = uVar2;
  name._M_len._0_7_ = in_stack_ffffffffffffffc8;
  name._M_str = (char *)in_stack_ffffffffffffffd0;
  defineBrokerBuilder(in_stack_ffffffffffffffc0,name,in_stack_ffffffffffffffbc);
  std::shared_ptr<helics::BrokerFactory::BrokerBuilder>::~shared_ptr
            ((shared_ptr<helics::BrokerFactory::BrokerBuilder> *)0x4501ee);
  std::
  shared_ptr<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18>_>_>
  ::~shared_ptr((shared_ptr<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::inproc::InprocComms,_(gmlc::networking::InterfaceTypes)4,_18>_>_>
                 *)0x45023e);
  sVar1.super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)in_RDI;
  return (shared_ptr<helics::BrokerFactory::BrokerBuilder>)
         sVar1.super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BrokerBuilder> addBrokerType(std::string_view brokerTypeName, int code)
    {
        auto bld = std::make_shared<BrokerTypeBuilder<BrokerTYPE>>();
        std::shared_ptr<BrokerBuilder> bbld = std::static_pointer_cast<BrokerBuilder>(bld);
        defineBrokerBuilder(bbld, brokerTypeName, code);
        return bbld;
    }